

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntStateGatherAcceleration
          (ChNodeFEAxyzDDD *this,uint off_a,ChStateDelta *a)

{
  Index index_3;
  double *pdVar1;
  Index index;
  ulong uVar2;
  ulong uVar3;
  
  if ((long)(ulong)off_a <=
      (a->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
    pdVar1 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + off_a
    ;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
      uVar2 = uVar3;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] =
             (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
             [uVar3 - 0xd];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] =
             (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
             [uVar2 - 0xd];
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    if ((long)(ulong)(off_a + 3) <=
        (a->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar1 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               (off_a + 3);
      uVar2 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
        uVar2 = uVar3;
      }
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          pdVar1[uVar3] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dtdt.m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if (uVar2 < 3) {
        do {
          pdVar1[uVar2] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dtdt.m_data[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar2 != 3);
      }
      if ((long)(ulong)(off_a + 6) <=
          (a->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar1 = (a->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 (off_a + 6);
        uVar2 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar2 = uVar3;
        }
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            pdVar1[uVar3] = (this->super_ChNodeFEAxyzDD).DD_dtdt.m_data[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        if (uVar2 < 3) {
          do {
            pdVar1[uVar2] = (this->super_ChNodeFEAxyzDD).DD_dtdt.m_data[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar2 != 3);
        }
        if ((long)(ulong)(off_a + 9) <=
            (a->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
          pdVar1 = (a->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   (off_a + 9);
          uVar2 = 3;
          if ((((ulong)pdVar1 & 7) == 0) &&
             (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
            uVar2 = uVar3;
          }
          if (uVar2 != 0) {
            uVar3 = 0;
            do {
              pdVar1[uVar3] = (this->DDD_dtdt).m_data[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
          }
          if (uVar2 < 3) {
            do {
              pdVar1[uVar2] = (this->DDD_dtdt).m_data[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar2 != 3);
          }
          return;
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateGatherAcceleration(const unsigned int off_a, ChStateDelta& a) {
    a.segment(off_a + 0, 3) = pos_dtdt.eigen();
    a.segment(off_a + 3, 3) = D_dtdt.eigen();
    a.segment(off_a + 6, 3) = DD_dtdt.eigen();
	a.segment(off_a + 9, 3) = DDD_dtdt.eigen();
}